

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O1

bool ApplicativeHelper::isUnderApplied(TermList head,uint argNum)

{
  int iVar1;
  
  iVar1 = *(int *)(*(long *)(*(long *)(DAT_00b7e1b0 + 0x60) +
                            (ulong)*(uint *)(head._content + 8) * 8) + 0x48);
  if ((((argNum != 0) || (iVar1 != 3)) && ((1 < argNum || (iVar1 != 4)))) &&
     ((2 < argNum || (1 < iVar1 - 1U)))) {
    return iVar1 == 0 && argNum < 3;
  }
  return true;
}

Assistant:

Signature::Combinator ApplicativeHelper::getComb (const TermList head) 
{
  return env.signature->getFunction(head.term()->functor())->combinator();
}